

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O1

PAL_ERROR CorUnix::CPalSynchronizationManager::DeferThreadConditionSignaling
                    (CPalThread *pthrCurrent,CPalThread *pthrTarget)

{
  LONG *pLVar1;
  int iVar2;
  _LIST_ENTRY *p_Var3;
  bool bVar4;
  _LIST_ENTRY *p_Var5;
  PAL_ERROR PVar6;
  
  iVar2 = (pthrCurrent->synchronizationInfo).m_lPendingSignalingCount;
  if (pthrTarget == pthrCurrent) {
    fprintf(_stderr,"] %s %s:%d","DeferThreadConditionSignaling",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x881);
    fprintf(_stderr,"Expression: pthrTarget != pthrCurrent\n");
  }
  if (iVar2 < 10) {
    (pthrCurrent->synchronizationInfo).m_rgpthrPendingSignalings[iVar2] = pthrTarget;
  }
  else {
    p_Var5 = (_LIST_ENTRY *)InternalMalloc(0x18);
    if (p_Var5 == (_LIST_ENTRY *)0x0) {
      p_Var5 = (_LIST_ENTRY *)0x0;
    }
    else {
      p_Var5->Flink = (_LIST_ENTRY *)0x0;
      p_Var5->Blink = (_LIST_ENTRY *)0x0;
      p_Var5[1].Flink = (_LIST_ENTRY *)0x0;
    }
    if (p_Var5 == (_LIST_ENTRY *)0x0) {
      PVar6 = 8;
      bVar4 = false;
      goto LAB_0013b65d;
    }
    p_Var5[1].Flink = (_LIST_ENTRY *)pthrTarget;
    p_Var3 = (pthrCurrent->synchronizationInfo).m_lePendingSignalingsOverflowList.Blink;
    p_Var5->Flink = &(pthrCurrent->synchronizationInfo).m_lePendingSignalingsOverflowList;
    p_Var5->Blink = p_Var3;
    p_Var3->Flink = p_Var5;
    (pthrCurrent->synchronizationInfo).m_lePendingSignalingsOverflowList.Blink = p_Var5;
  }
  PVar6 = 0;
  bVar4 = true;
LAB_0013b65d:
  if (bVar4) {
    pLVar1 = &(pthrCurrent->synchronizationInfo).m_lPendingSignalingCount;
    *pLVar1 = *pLVar1 + 1;
    CPalThread::AddThreadReference(pthrTarget);
  }
  return PVar6;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::DeferThreadConditionSignaling(
        CPalThread * pthrCurrent,
        CPalThread * pthrTarget)
    {
        PAL_ERROR palErr = NO_ERROR;
        LONG lCount = pthrCurrent->synchronizationInfo.m_lPendingSignalingCount;

        _ASSERTE(pthrTarget != pthrCurrent);

        if (CThreadSynchronizationInfo::PendingSignalingsArraySize > lCount)
        {
            // If there is available room, add the target thread object to
            // the array of pending thread signalings.
            pthrCurrent->synchronizationInfo.m_rgpthrPendingSignalings[lCount] = pthrTarget;
        }
        else
        {
            // If the array is full, add the target thread object at the end
            // of the overflow list
            DeferredSignalingListNode * pdsln =
                InternalNew<DeferredSignalingListNode>();

            if (pdsln)
            {
                pdsln->pthrTarget = pthrTarget;

                // Add the note to the end of the list.
                // Note: no need to synchronize the access to this list since
                // it is meant to be accessed only by the owner thread.
                InsertTailList(&pthrCurrent->synchronizationInfo.m_lePendingSignalingsOverflowList,
                               &pdsln->Link);
            }
            else
            {
                palErr = ERROR_NOT_ENOUGH_MEMORY;
            }
        }

        if (NO_ERROR == palErr)
        {
            // Increment the count of pending signalings
            pthrCurrent->synchronizationInfo.m_lPendingSignalingCount += 1;

            // Add a reference to the target CPalThread object; this is
            // needed since deferring signaling after releasing the synch
            // locks implies accessing the target thread object without
            // holding the local synch lock. In rare circumstances, the
            // target thread may have already exited while deferred signaling
            // takes place, therefore invalidating the thread object. The
            // reference added here ensures that the thread object is still
            // good, even if the target thread has exited.
            pthrTarget->AddThreadReference();
        }
        return palErr;
    }